

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string *local_d8;
  string local_80 [8];
  string shader_source;
  size_t string_index;
  allocator<char> local_41;
  string *local_40;
  string local_38 [8];
  string input [1];
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclUnsizedArrays2<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  local_40 = local_38;
  input[0].field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"    float [] x = float[](1), y;\n\n",&local_41);
  std::allocator<char>::~allocator(&local_41);
  for (shader_source.field_2._8_8_ = 0; shader_source.field_2._8_8_ == 0;
      shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
    std::__cxx11::string::string(local_80);
    std::__cxx11::string::operator+=(local_80,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=
              (local_80,(string *)(input[shader_source.field_2._8_8_ + -1].field_2._M_local_buf + 8)
              );
    switch(input[0].field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=(local_80,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=(local_80,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=(local_80,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xa3a);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=(local_80,(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)(uint)input[0].field_2._12_4_,local_80);
    std::__cxx11::string::~string(local_80);
  }
  local_d8 = (string *)(input[0].field_2._M_local_buf + 8);
  do {
    local_d8 = local_d8 + -0x20;
    std::__cxx11::string::~string(local_d8);
  } while (local_d8 != local_38);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedArrays2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string input[] = { "    float [] x = float[](1), y;\n\n" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source;

		shader_source += shader_start;
		shader_source += input[string_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION, tested_shader_type, shader_source);
	} /* for (int string_index = 0; ...) */
}